

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O3

void av1_write_intra_coeffs_mb(AV1_COMMON *cm,MACROBLOCK *x,aom_writer *w,BLOCK_SIZE bsize)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  MB_MODE_INFO *pMVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined7 in_register_00000009;
  int block_00;
  byte tx_size;
  uint uVar15;
  uint uVar16;
  uint blk_row;
  uint uVar17;
  uint blk_col;
  int iVar18;
  int iVar19;
  bool bVar20;
  int block [3];
  
  uVar1 = cm->seq_params->monochrome;
  block[2] = 0;
  block[0] = 0;
  block[1] = 0;
  uVar10 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  uVar16 = (uint)block_size_wide[uVar10];
  iVar18 = (x->e_mbd).mb_to_right_edge;
  if (iVar18 < 0) {
    uVar16 = (uint)block_size_wide[uVar10] +
             (iVar18 >> ((char)(x->e_mbd).plane[0].subsampling_x + 3U & 0x1f));
  }
  uVar16 = (int)uVar16 >> 2;
  uVar15 = (uint)block_size_high[uVar10];
  iVar18 = (x->e_mbd).mb_to_bottom_edge;
  if (iVar18 < 0) {
    uVar15 = (uint)block_size_high[uVar10] +
             (iVar18 >> ((char)(x->e_mbd).plane[0].subsampling_y + 3U & 0x1f));
  }
  uVar15 = (int)uVar15 >> 2;
  uVar11 = 0x10;
  if ((int)uVar16 < 0x10) {
    uVar11 = uVar16;
  }
  uVar7 = 0x10;
  if ((int)uVar15 < 0x10) {
    uVar7 = uVar15;
  }
  if (0 < (int)uVar15) {
    uVar17 = 0;
    do {
      uVar8 = uVar7 + uVar17;
      if (0 < (int)uVar16) {
        uVar12 = uVar15;
        if ((int)uVar8 < (int)uVar15) {
          uVar12 = uVar8;
        }
        uVar13 = 0;
LAB_001bbe76:
        uVar14 = uVar13 + uVar11;
        uVar9 = uVar16;
        if ((int)uVar14 < (int)uVar16) {
          uVar9 = uVar14;
        }
        uVar10 = 0;
        do {
          if (uVar10 == 0) {
            pMVar6 = *(x->e_mbd).mi;
            if ((x->e_mbd).lossless[*(ushort *)&pMVar6->field_0xa7 & 7] == 0) {
              tx_size = pMVar6->tx_size;
              goto LAB_001bbf4c;
            }
LAB_001bbf49:
            tx_size = 0;
          }
          else {
            if ((x->e_mbd).is_chroma_ref != true) goto LAB_001bc0d3;
            pMVar6 = *(x->e_mbd).mi;
            if ((x->e_mbd).lossless[*(ushort *)&pMVar6->field_0xa7 & 7] != 0) goto LAB_001bbf49;
            bVar2 = ""[av1_ss_size_lookup[pMVar6->bsize][(x->e_mbd).plane[uVar10].subsampling_x]
                       [(x->e_mbd).plane[uVar10].subsampling_y]];
            if (bVar2 < 0x11) {
              tx_size = 3;
              if ((1 < bVar2 - 0xb) && (bVar2 != 4)) {
LAB_001bc0cb:
                tx_size = bVar2;
              }
            }
            else if (bVar2 == 0x11) {
              tx_size = 9;
            }
            else {
              if (bVar2 != 0x12) goto LAB_001bc0cb;
              tx_size = 10;
            }
          }
LAB_001bbf4c:
          bVar2 = (byte)(x->e_mbd).plane[uVar10].subsampling_y;
          bVar3 = (byte)(x->e_mbd).plane[uVar10].subsampling_x;
          iVar18 = (int)(((1 << (bVar2 & 0x1f)) >> 1) + uVar12) >> (bVar2 & 0x1f);
          iVar19 = (int)(((1 << (bVar3 & 0x1f)) >> 1) + uVar9) >> (bVar3 & 0x1f);
          blk_row = uVar17 >> (bVar2 & 0x1f);
          if ((int)blk_row < iVar18) {
            iVar4 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
            iVar5 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
            do {
              blk_col = uVar13 >> ((byte)(x->e_mbd).plane[uVar10].subsampling_x & 0x1f);
              if ((int)blk_col < iVar19) {
                block_00 = block[uVar10];
                do {
                  av1_write_coeffs_txb(cm,x,w,blk_row,blk_col,(int)uVar10,block_00,tx_size);
                  block_00 = block_00 + iVar5 * iVar4;
                  blk_col = blk_col + iVar5;
                } while ((int)blk_col < iVar19);
                block[uVar10] = block_00;
              }
              blk_row = blk_row + iVar4;
            } while ((int)blk_row < iVar18);
          }
          if ((uVar1 != '\0') || (bVar20 = 1 < uVar10, uVar10 = uVar10 + 1, bVar20))
          goto LAB_001bc0d3;
        } while( true );
      }
LAB_001bc0dc:
      uVar17 = uVar8;
    } while ((int)uVar8 < (int)uVar15);
  }
  return;
LAB_001bc0d3:
  uVar13 = uVar14;
  if ((int)uVar16 <= (int)uVar14) goto LAB_001bc0dc;
  goto LAB_001bbe76;
}

Assistant:

void av1_write_intra_coeffs_mb(const AV1_COMMON *const cm, MACROBLOCK *x,
                               aom_writer *w, BLOCK_SIZE bsize) {
  MACROBLOCKD *xd = &x->e_mbd;
  const int num_planes = av1_num_planes(cm);
  int block[MAX_MB_PLANE] = { 0 };
  int row, col;
  assert(bsize == get_plane_block_size(bsize, xd->plane[0].subsampling_x,
                                       xd->plane[0].subsampling_y));
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const BLOCK_SIZE max_unit_bsize = BLOCK_64X64;
  int mu_blocks_wide = mi_size_wide[max_unit_bsize];
  int mu_blocks_high = mi_size_high[max_unit_bsize];
  mu_blocks_wide = AOMMIN(max_blocks_wide, mu_blocks_wide);
  mu_blocks_high = AOMMIN(max_blocks_high, mu_blocks_high);

  for (row = 0; row < max_blocks_high; row += mu_blocks_high) {
    for (col = 0; col < max_blocks_wide; col += mu_blocks_wide) {
      for (int plane = 0; plane < num_planes; ++plane) {
        if (plane && !xd->is_chroma_ref) break;
        const TX_SIZE tx_size = av1_get_tx_size(plane, xd);
        const int stepr = tx_size_high_unit[tx_size];
        const int stepc = tx_size_wide_unit[tx_size];
        const int step = stepr * stepc;
        const struct macroblockd_plane *const pd = &xd->plane[plane];
        const int unit_height = ROUND_POWER_OF_TWO(
            AOMMIN(mu_blocks_high + row, max_blocks_high), pd->subsampling_y);
        const int unit_width = ROUND_POWER_OF_TWO(
            AOMMIN(mu_blocks_wide + col, max_blocks_wide), pd->subsampling_x);
        for (int blk_row = row >> pd->subsampling_y; blk_row < unit_height;
             blk_row += stepr) {
          for (int blk_col = col >> pd->subsampling_x; blk_col < unit_width;
               blk_col += stepc) {
            av1_write_coeffs_txb(cm, x, w, blk_row, blk_col, plane,
                                 block[plane], tx_size);
            block[plane] += step;
          }
        }
      }
    }
  }
}